

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

PageMarkBitVector * __thiscall
Memory::HeapBlockMap64::GetPageMarkBitVector(HeapBlockMap64 *this,void *address)

{
  code *pcVar1;
  bool bVar2;
  Node *pNVar3;
  PageMarkBitVector *pPVar4;
  undefined8 *in_FS_OFFSET;
  Node *node;
  void *address_local;
  HeapBlockMap64 *this_local;
  
  pNVar3 = FindNode(this,address);
  if (pNVar3 == (Node *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x526,"(node != nullptr)","node != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  pPVar4 = HeapBlockMap32::GetPageMarkBitVector(&pNVar3->map,address);
  return pPVar4;
}

Assistant:

HeapBlockMap32::PageMarkBitVector *
HeapBlockMap64::GetPageMarkBitVector(void * address)
{
    Node * node = FindNode(address);
    Assert(node != nullptr);
    return node->map.GetPageMarkBitVector(address);
}